

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_typed_array_get_buffer(JSContext *ctx,JSValue this_val,int is_dataview)

{
  JSRefCountHeader *p;
  JSObject *pJVar1;
  JSValueUnion JVar2;
  int64_t iVar3;
  JSValue JVar4;
  
  pJVar1 = get_typed_array(ctx,this_val,is_dataview);
  if (pJVar1 == (JSObject *)0x0) {
    iVar3 = 6;
    JVar2.float64 = 0.0;
  }
  else {
    JVar2 = (JSValueUnion)((pJVar1->u).map_iterator_data)->cur_record;
    *(int *)JVar2.ptr = *JVar2.ptr + 1;
    iVar3 = -1;
  }
  JVar4.tag = iVar3;
  JVar4.u.ptr = JVar2.ptr;
  return JVar4;
}

Assistant:

static JSValue js_typed_array_get_buffer(JSContext *ctx,
                                         JSValueConst this_val, int is_dataview)
{
    JSObject *p;
    JSTypedArray *ta;
    p = get_typed_array(ctx, this_val, is_dataview);
    if (!p)
        return JS_EXCEPTION;
    ta = p->u.typed_array;
    return JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, ta->buffer));
}